

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFMFileReader.cpp
# Opt level: O1

EStatusCode __thiscall PFMFileReader::ReadDWord(PFMFileReader *this,DWORD *outDWORD)

{
  int iVar1;
  EStatusCode EVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Byte buffer;
  undefined8 uStack_18;
  
  *outDWORD = 0;
  if (this->mInternalReadStatus == eFailure) {
LAB_001e1adf:
    EVar2 = this->mInternalReadStatus;
  }
  else {
    uStack_18 = in_RAX;
    iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mReaderStream,(long)&uStack_18 + 7,1);
    if (CONCAT44(extraout_var,iVar1) == 1) {
      *outDWORD = uStack_18 >> 0x38;
      iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                        (this->mReaderStream,(long)&uStack_18 + 7,1);
      if (CONCAT44(extraout_var_00,iVar1) == 1) {
        *outDWORD = *outDWORD | (uStack_18 >> 0x38) << 8;
        iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                          (this->mReaderStream,(long)&uStack_18 + 7,1);
        if (CONCAT44(extraout_var_01,iVar1) == 1) {
          *outDWORD = *outDWORD | (ulong)uStack_18._7_1_ << 0x10;
          iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                            (this->mReaderStream,(long)&uStack_18 + 7,1);
          if (CONCAT44(extraout_var_02,iVar1) == 1) {
            *outDWORD = *outDWORD | (ulong)uStack_18._7_1_ << 0x18;
            goto LAB_001e1adf;
          }
        }
      }
    }
    this->mInternalReadStatus = eFailure;
    EVar2 = eFailure;
  }
  return EVar2;
}

Assistant:

EStatusCode PFMFileReader::ReadDWord(DWORD& outDWORD)
{
	IOBasicTypes::Byte buffer;
	outDWORD = 0;

	if(mInternalReadStatus != PDFHummus::eFailure)
	{
		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD = buffer;

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 8);

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 16);

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 24);
	}

	return mInternalReadStatus;
}